

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fib.c
# Opt level: O0

void ndn_fib_init(void *memory,ndn_table_id_t capacity,ndn_nametree_t *nametree)

{
  ndn_fib_t *self;
  ndn_table_id_t i;
  ndn_nametree_t *nametree_local;
  ndn_table_id_t capacity_local;
  void *memory_local;
  
  *(ndn_table_id_t *)((long)memory + 8) = capacity;
  *(ndn_nametree_t **)memory = nametree;
  for (self._6_2_ = 0; self._6_2_ < capacity; self._6_2_ = self._6_2_ + 1) {
    ndn_fib_entry_reset((ndn_fib_entry_t *)((long)memory + (ulong)self._6_2_ * 0x20 + 0x10));
  }
  return;
}

Assistant:

void
ndn_fib_init(void* memory, ndn_table_id_t capacity, ndn_nametree_t* nametree)
{
  ndn_table_id_t i;
  ndn_fib_t* self = (ndn_fib_t*)memory;
  self->capacity = capacity;
  self->nametree = nametree;
  for(i = 0; i < capacity; i ++){
    ndn_fib_entry_reset(&self->slots[i]);
  }
}